

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalyticSolution.cpp
# Opt level: O3

FADFADSTATE * FADexp(FADFADSTATE *__return_storage_ptr__,FADFADSTATE *x)

{
  uint sz;
  double *pdVar1;
  double *pdVar2;
  FADFADSTATE *extraout_RAX;
  int i;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  double dVar6;
  Fad<double> expaval;
  Fad<double> local_a0;
  double local_80;
  undefined1 local_78 [8];
  Fad<double> local_70;
  undefined1 local_50 [32];
  
  FadFuncExp<Fad<double>_>::FadFuncExp((FadFuncExp<Fad<double>_> *)local_50,&x->val_);
  FadExpr<FadFuncExp<Fad<double>_>_>::FadExpr
            ((FadExpr<FadFuncExp<Fad<double>_>_> *)local_78,(FadFuncExp<Fad<double>_> *)local_50);
  Fad<double>::~Fad((Fad<double> *)local_50);
  local_a0.val_ = exp(local_70.val_);
  local_a0.dx_.num_elts = 0;
  local_a0.dx_.ptr_to_data = (double *)0x0;
  if ((long)local_70.dx_.num_elts < 1) {
    local_a0.defaultVal = 0.0;
  }
  else {
    local_a0.dx_.num_elts = local_70.dx_.num_elts;
    uVar4 = (long)local_70.dx_.num_elts * 8;
    pdVar1 = (double *)operator_new__(uVar4);
    local_a0.defaultVal = 0.0;
    uVar3 = 0;
    local_a0.dx_.ptr_to_data = pdVar1;
    do {
      pdVar2 = (double *)((long)local_70.dx_.ptr_to_data + uVar3);
      if (local_70.dx_.num_elts == 0) {
        pdVar2 = &local_70.defaultVal;
      }
      local_80 = *pdVar2;
      dVar6 = exp(local_70.val_);
      *(double *)((long)pdVar1 + uVar3) = dVar6 * local_80;
      uVar3 = uVar3 + 8;
    } while (uVar4 != uVar3);
  }
  Fad<double>::~Fad(&local_70);
  sz = (x->dx_).num_elts;
  Fad<Fad<double>_>::Fad(__return_storage_ptr__,sz,&local_a0);
  if (0 < (int)sz) {
    lVar5 = 0;
    i = 0;
    do {
      Fad<Fad<double>_>::dx((Fad<double> *)local_78,x,i);
      local_50._0_8_ = &local_a0;
      local_50._8_8_ = (Fad<double> *)local_78;
      Fad<double>::operator=
                ((Fad<double> *)((long)&((__return_storage_ptr__->dx_).ptr_to_data)->val_ + lVar5),
                 (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)local_50);
      Fad<double>::~Fad((Fad<double> *)local_78);
      i = i + 1;
      lVar5 = lVar5 + 0x20;
    } while ((ulong)sz << 5 != lVar5);
  }
  Fad<double>::~Fad(&local_a0);
  return extraout_RAX;
}

Assistant:

static FADFADSTATE FADexp(FADFADSTATE x)
{
    Fad<STATE> expaval = exp(x.val());
    int sz = x.size();
    FADFADSTATE expa(sz,expaval);
    for (int i=0; i<sz; i++) {
        expa.fastAccessDx(i) = expaval*x.dx(i);
    }
    return expa;
}